

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O0

void Abc_SclFindNodesToUpdate
               (Abc_Obj_t *pPivot,Vec_Int_t **pvNodes,Vec_Int_t **pvEvals,Abc_Obj_t *pExtra)

{
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int local_60;
  int local_5c;
  int k;
  int i;
  Vec_Int_t *vEvals;
  Vec_Int_t *vNodes;
  Abc_Obj_t *pNext2;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *p;
  Abc_Obj_t *pExtra_local;
  Vec_Int_t **pvEvals_local;
  Vec_Int_t **pvNodes_local;
  Abc_Obj_t *pPivot_local;
  
  pNtk = Abc_ObjNtk(pPivot);
  p_00 = *pvNodes;
  p_01 = *pvEvals;
  iVar1 = Abc_ObjIsNode(pPivot);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                  ,0xdc,
                  "void Abc_SclFindNodesToUpdate(Abc_Obj_t *, Vec_Int_t **, Vec_Int_t **, Abc_Obj_t *)"
                 );
  }
  if ((*(uint *)&pPivot->field_0x14 >> 4 & 1) == 0) {
    __assert_fail("pPivot->fMarkA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                  ,0xdd,
                  "void Abc_SclFindNodesToUpdate(Abc_Obj_t *, Vec_Int_t **, Vec_Int_t **, Abc_Obj_t *)"
                 );
  }
  Vec_IntClear(p_00);
  for (local_5c = 0; iVar1 = Abc_ObjFaninNum(pPivot), local_5c < iVar1; local_5c = local_5c + 1) {
    pAVar3 = Abc_ObjFanin(pPivot,local_5c);
    iVar1 = Abc_ObjIsCi(pAVar3);
    if ((iVar1 != 0) || (iVar1 = Abc_ObjFaninNum(pAVar3), 0 < iVar1)) {
      uVar2 = Abc_ObjId(pAVar3);
      Vec_IntPush(p_00,uVar2);
    }
  }
  uVar2 = Abc_ObjId(pPivot);
  Vec_IntPush(p_00,uVar2);
  if (pExtra != (Abc_Obj_t *)0x0) {
    uVar2 = Abc_ObjId(pExtra);
    Vec_IntPush(p_00,uVar2);
  }
  for (local_5c = 0; iVar1 = Abc_ObjFanoutNum(pPivot), local_5c < iVar1; local_5c = local_5c + 1) {
    pAVar3 = Abc_ObjFanout(pPivot,local_5c);
    iVar1 = Abc_ObjIsNode(pAVar3);
    if ((iVar1 != 0) && ((*(uint *)&pAVar3->field_0x14 >> 4 & 1) != 0)) {
      uVar2 = Abc_ObjId(pAVar3);
      Vec_IntPush(p_00,uVar2);
      for (local_60 = 0; iVar1 = Abc_ObjFanoutNum(pAVar3), local_60 < iVar1; local_60 = local_60 + 1
          ) {
        pAVar4 = Abc_ObjFanout(pAVar3,local_60);
        iVar1 = Abc_ObjIsNode(pAVar4);
        if ((iVar1 != 0) && ((*(uint *)&pAVar4->field_0x14 >> 4 & 1) != 0)) {
          uVar2 = Abc_ObjId(pAVar4);
          Vec_IntPush(p_00,uVar2);
        }
      }
    }
  }
  Vec_IntUniqify(p_00);
  for (local_5c = 0; iVar1 = Vec_IntSize(p_00), local_5c < iVar1; local_5c = local_5c + 1) {
    iVar1 = Vec_IntEntry(p_00,local_5c);
    pAVar3 = Abc_NtkObj(pNtk,iVar1);
    if (pAVar3 != (Abc_Obj_t *)0x0) {
      if ((*(uint *)&pAVar3->field_0x14 >> 5 & 1) != 0) {
        __assert_fail("pObj->fMarkB == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                      ,0xf3,
                      "void Abc_SclFindNodesToUpdate(Abc_Obj_t *, Vec_Int_t **, Vec_Int_t **, Abc_Obj_t *)"
                     );
      }
      *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffdf | 0x20;
    }
  }
  Vec_IntClear(p_01);
  local_5c = 0;
  do {
    iVar1 = Vec_IntSize(p_00);
    if (iVar1 <= local_5c) {
      iVar1 = Vec_IntSize(p_01);
      if (0 < iVar1) {
        for (local_5c = 0; iVar1 = Vec_IntSize(p_00), local_5c < iVar1; local_5c = local_5c + 1) {
          iVar1 = Vec_IntEntry(p_00,local_5c);
          pAVar3 = Abc_NtkObj(pNtk,iVar1);
          if (pAVar3 != (Abc_Obj_t *)0x0) {
            *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xffffffdf;
          }
        }
        return;
      }
      __assert_fail("Vec_IntSize(vEvals) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                    ,0x101,
                    "void Abc_SclFindNodesToUpdate(Abc_Obj_t *, Vec_Int_t **, Vec_Int_t **, Abc_Obj_t *)"
                   );
    }
    iVar1 = Vec_IntEntry(p_00,local_5c);
    pAVar3 = Abc_NtkObj(pNtk,iVar1);
    if (pAVar3 != (Abc_Obj_t *)0x0) {
      for (local_60 = 0; iVar1 = Abc_ObjFanoutNum(pAVar3), local_60 < iVar1; local_60 = local_60 + 1
          ) {
        pAVar4 = Abc_ObjFanout(pAVar3,local_60);
        if (((*(uint *)&pAVar4->field_0x14 >> 4 & 1) != 0) &&
           ((*(uint *)&pAVar4->field_0x14 >> 5 & 1) == 0)) {
          if ((*(uint *)&pAVar3->field_0x14 >> 5 & 1) == 0) {
            __assert_fail("pObj->fMarkB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                          ,0xfd,
                          "void Abc_SclFindNodesToUpdate(Abc_Obj_t *, Vec_Int_t **, Vec_Int_t **, Abc_Obj_t *)"
                         );
          }
          uVar2 = Abc_ObjId(pAVar3);
          Vec_IntPush(p_01,uVar2);
          break;
        }
      }
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

void Abc_SclFindNodesToUpdate( Abc_Obj_t * pPivot, Vec_Int_t ** pvNodes, Vec_Int_t ** pvEvals, Abc_Obj_t * pExtra )
{
    Abc_Ntk_t * p = Abc_ObjNtk(pPivot);
    Abc_Obj_t * pObj, * pNext, * pNext2;
    Vec_Int_t * vNodes = *pvNodes;
    Vec_Int_t * vEvals = *pvEvals;
    int i, k;
    assert( Abc_ObjIsNode(pPivot) );
    assert( pPivot->fMarkA );
    // collect fanins, node, and fanouts
    Vec_IntClear( vNodes );
    Abc_ObjForEachFanin( pPivot, pNext, i )
//        if ( Abc_ObjIsNode(pNext) && Abc_ObjFaninNum(pNext) > 0 )
        if ( Abc_ObjIsCi(pNext) || Abc_ObjFaninNum(pNext) > 0 )
            Vec_IntPush( vNodes, Abc_ObjId(pNext) );
    Vec_IntPush( vNodes, Abc_ObjId(pPivot) );
    if ( pExtra )
        Vec_IntPush( vNodes, Abc_ObjId(pExtra) );
    Abc_ObjForEachFanout( pPivot, pNext, i )
        if ( Abc_ObjIsNode(pNext) && pNext->fMarkA )
        {
            Vec_IntPush( vNodes, Abc_ObjId(pNext) );
            Abc_ObjForEachFanout( pNext, pNext2, k )
                if ( Abc_ObjIsNode(pNext2) && pNext2->fMarkA )
                    Vec_IntPush( vNodes, Abc_ObjId(pNext2) );
        }
    Vec_IntUniqify( vNodes );
    // label nodes
    Abc_NtkForEachObjVec( vNodes, p, pObj, i )
    {
        assert( pObj->fMarkB == 0 );
        pObj->fMarkB = 1;
    }
    // collect nodes visible from the critical paths
    Vec_IntClear( vEvals );
    Abc_NtkForEachObjVec( vNodes, p, pObj, i )
        Abc_ObjForEachFanout( pObj, pNext, k )
            if ( pNext->fMarkA && !pNext->fMarkB )
//            if ( !pNext->fMarkB )
            {
                assert( pObj->fMarkB );
                Vec_IntPush( vEvals, Abc_ObjId(pObj) );
                break;
            }
    assert( Vec_IntSize(vEvals) > 0 );
    // label nodes
    Abc_NtkForEachObjVec( vNodes, p, pObj, i )
        pObj->fMarkB = 0;
}